

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool __thiscall BaseIndex::Init(BaseIndex *this)

{
  BlockManager *this_00;
  pointer ppCVar1;
  string original;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Chainstate *pCVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference hash;
  CBlockIndex *pCVar5;
  CBlockIndex *pCVar6;
  char *args;
  long in_FS_OFFSET;
  undefined1 auStack_118 [16];
  CBlockLocator locator;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  string local_d8 [32];
  bilingual_str local_b8;
  bilingual_str local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CThreadInterrupt::reset(&this->m_interrupt);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_78,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
             ,0x58,false);
  iVar3 = (*((this->m_chain)._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36])();
  pCVar4 = ChainstateManager::GetChainstateForIndexing
                     (*(ChainstateManager **)(CONCAT44(extraout_var,iVar3) + 0x50));
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_78);
  this->m_chainstate = pCVar4;
  iVar3 = (*((this->m_chain)._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36])();
  ValidationSignals::RegisterValidationInterface
            (*(ValidationSignals **)(CONCAT44(extraout_var_00,iVar3) + 0xe0),
             &this->super_CValidationInterface);
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
  bVar2 = DB::ReadBestBlock((DB *)CONCAT44(extraout_var_01,iVar3),&locator);
  if ((!bVar2) &&
     (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish =
         locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  args = "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp";
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock10,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
             ,0x62,false);
  pCVar4 = this->m_chainstate;
  if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start ==
      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    SetBestBlockIndex(this,(CBlockIndex *)0x0);
  }
  else {
    this_00 = pCVar4->m_blockman;
    hash = std::vector<uint256,_std::allocator<uint256>_>::at(&locator.vHave,0);
    pCVar5 = ::node::BlockManager::LookupBlockIndex(this_00,hash);
    if (pCVar5 == (CBlockIndex *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_d8,"%s: best block of the index not found. Please rebuild the index.",
                 (allocator<char> *)(auStack_118 + 0xf));
      original.field_2._M_allocated_capacity =
           (size_type)
           locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
      original._M_dataplus._M_p = (pointer)auStack_118._0_8_;
      original._M_string_length = auStack_118._8_8_;
      original.field_2._8_8_ =
           locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
      Untranslated(&local_b8,original);
      tinyformat::format<std::__cxx11::string>
                (&local_78,(tinyformat *)&local_b8,(bilingual_str *)&this->m_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      bVar2 = InitError(&local_78);
      bilingual_str::~bilingual_str(&local_78);
      bilingual_str::~bilingual_str(&local_b8);
      std::__cxx11::string::~string(local_d8);
      goto LAB_006d956a;
    }
    SetBestBlockIndex(this,pCVar5);
  }
  pCVar5 = (this->m_best_block_index)._M_b._M_p;
  if (pCVar5 != (CBlockIndex *)0x0) {
    CBlockIndex::GetBlockHash((uint256 *)&local_b8,pCVar5);
    local_b8.translated._M_dataplus._M_p._0_4_ = pCVar5->nHeight;
    local_78.original._M_dataplus._M_p._0_4_ = local_b8.original._M_dataplus._M_p._0_4_;
    local_78.original._M_dataplus._M_p._4_4_ = local_b8.original._M_dataplus._M_p._4_4_;
    local_78.original._M_string_length._0_4_ = (undefined4)local_b8.original._M_string_length;
    local_78.original._M_string_length._4_4_ = local_b8.original._M_string_length._4_4_;
    local_78.original.field_2._M_allocated_capacity =
         local_b8.original.field_2._M_allocated_capacity;
    local_78.original.field_2._8_8_ = local_b8.original.field_2._8_8_;
    local_78.translated._M_dataplus._M_p._0_4_ = (int)local_b8.translated._M_dataplus._M_p;
  }
  local_78.translated._M_dataplus._M_p._4_1_ = pCVar5 != (CBlockIndex *)0x0;
  iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xb])(this);
  if ((char)iVar3 == '\0') {
    bVar2 = false;
  }
  else {
    ppCVar1 = (pCVar4->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar6 = (CBlockIndex *)0x0;
    }
    else {
      pCVar6 = ppCVar1[-1];
    }
    LOCK();
    (this->m_synced)._M_base._M_i = pCVar6 == pCVar5;
    UNLOCK();
    bVar2 = true;
    LOCK();
    (this->m_init)._M_base._M_i = true;
    UNLOCK();
  }
LAB_006d956a:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            ((_Vector_base<uint256,_std::allocator<uint256>_> *)&locator);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool BaseIndex::Init()
{
    AssertLockNotHeld(cs_main);

    // May need reset if index is being restarted.
    m_interrupt.reset();

    // m_chainstate member gives indexing code access to node internals. It is
    // removed in followup https://github.com/bitcoin/bitcoin/pull/24230
    m_chainstate = WITH_LOCK(::cs_main,
        return &m_chain->context()->chainman->GetChainstateForIndexing());
    // Register to validation interface before setting the 'm_synced' flag, so that
    // callbacks are not missed once m_synced is true.
    m_chain->context()->validation_signals->RegisterValidationInterface(this);

    CBlockLocator locator;
    if (!GetDB().ReadBestBlock(locator)) {
        locator.SetNull();
    }

    LOCK(cs_main);
    CChain& index_chain = m_chainstate->m_chain;

    if (locator.IsNull()) {
        SetBestBlockIndex(nullptr);
    } else {
        // Setting the best block to the locator's top block. If it is not part of the
        // best chain, we will rewind to the fork point during index sync
        const CBlockIndex* locator_index{m_chainstate->m_blockman.LookupBlockIndex(locator.vHave.at(0))};
        if (!locator_index) {
            return InitError(strprintf(Untranslated("%s: best block of the index not found. Please rebuild the index."), GetName()));
        }
        SetBestBlockIndex(locator_index);
    }

    // Child init
    const CBlockIndex* start_block = m_best_block_index.load();
    if (!CustomInit(start_block ? std::make_optional(interfaces::BlockKey{start_block->GetBlockHash(), start_block->nHeight}) : std::nullopt)) {
        return false;
    }

    // Note: this will latch to true immediately if the user starts up with an empty
    // datadir and an index enabled. If this is the case, indexation will happen solely
    // via `BlockConnected` signals until, possibly, the next restart.
    m_synced = start_block == index_chain.Tip();
    m_init = true;
    return true;
}